

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testobject.cpp
# Opt level: O0

void test_obj(float id,Am_Object *result,Am_Object *expected)

{
  ulong uVar1;
  ostream *poVar2;
  void *pvVar3;
  Am_Object *expected_local;
  Am_Object *result_local;
  float id_local;
  
  test_counter = test_counter + 1;
  if (suppress_successful == 0) {
    printf("%f     ",(double)id);
  }
  else if (test_counter % 0x32 == 0) {
    printf("Test %d\n",(ulong)(uint)test_counter);
  }
  uVar1 = Am_Object::operator==(result,(Am_Object *)expected);
  if ((uVar1 & 1) == 0) {
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,id);
    poVar2 = std::operator<<(poVar2,"       expected ");
    poVar2 = (ostream *)operator<<(poVar2,(Am_Object *)expected);
    poVar2 = std::operator<<(poVar2,", result is ");
    pvVar3 = (void *)operator<<(poVar2,(Am_Object *)result);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"*** TEST DID NOT SUCCEED. ***");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    failed_tests = failed_tests + 1;
  }
  else if (suppress_successful == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"  result is ");
    pvVar3 = (void *)operator<<(poVar2,(Am_Object *)result);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void
test_obj(float id, Am_Object result, Am_Object expected)
{
  ++test_counter;
  if (suppress_successful) {
    if ((test_counter % 50) == 0)
      printf("Test %d\n", test_counter);
  } else
    printf("%f     ", id);

  if (result == expected) {
    if (!suppress_successful)
      cout << "  result is " << result << endl;
  } else {
    cout << id << "       expected " << expected << ", result is " << result
         << endl
         << "*** TEST DID NOT SUCCEED. ***" << endl;
    ++failed_tests;
  }
}